

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_write_file(char *p,mbedtls_mpi *X,int radix,FILE *fout)

{
  size_t sVar1;
  size_t sVar2;
  char local_a08 [8];
  char s [2484];
  size_t plen;
  size_t slen;
  size_t n;
  FILE *pFStack_30;
  int ret;
  FILE *fout_local;
  mbedtls_mpi *pmStack_20;
  int radix_local;
  mbedtls_mpi *X_local;
  char *p_local;
  
  pFStack_30 = (FILE *)fout;
  fout_local._4_4_ = radix;
  pmStack_20 = X;
  X_local = (mbedtls_mpi *)p;
  memset(local_a08,0,0x9b4);
  n._4_4_ = mbedtls_mpi_write_string(pmStack_20,fout_local._4_4_,local_a08,0x9b2,&slen);
  if (n._4_4_ == 0) {
    if (X_local == (mbedtls_mpi *)0x0) {
      X_local = (mbedtls_mpi *)(anon_var_dwarf_9748c + 9);
    }
    register0x00000000 = strlen((char *)X_local);
    sVar1 = strlen(local_a08);
    local_a08[sVar1] = '\r';
    local_a08[sVar1 + 1] = '\n';
    if (pFStack_30 == (FILE *)0x0) {
      printf("%s%s",X_local,local_a08);
    }
    else {
      sVar2 = fwrite(X_local,1,stack0xffffffffffffffb0,pFStack_30);
      if ((sVar2 != stack0xffffffffffffffb0) ||
         (sVar2 = fwrite(local_a08,1,sVar1 + 2,pFStack_30), sVar2 != sVar1 + 2)) {
        return -2;
      }
    }
  }
  return n._4_4_;
}

Assistant:

int mbedtls_mpi_write_file( const char *p, const mbedtls_mpi *X, int radix, FILE *fout )
{
    int ret;
    size_t n, slen, plen;
    /*
     * Buffer should have space for (short) label and decimal formatted MPI,
     * newline characters and '\0'
     */
    char s[ MBEDTLS_MPI_RW_BUFFER_SIZE ];

    memset( s, 0, sizeof( s ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_string( X, radix, s, sizeof( s ) - 2, &n ) );

    if( p == NULL ) p = "";

    plen = strlen( p );
    slen = strlen( s );
    s[slen++] = '\r';
    s[slen++] = '\n';

    if( fout != NULL )
    {
        if( fwrite( p, 1, plen, fout ) != plen ||
            fwrite( s, 1, slen, fout ) != slen )
            return( MBEDTLS_ERR_MPI_FILE_IO_ERROR );
    }
    else
        mbedtls_printf( "%s%s", p, s );

cleanup:

    return( ret );
}